

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O3

void libdef_module(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  undefined8 extraout_RAX;
  size_t sVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  uint extraout_EDX;
  char *pcVar8;
  uint kind;
  ulong uVar9;
  char *__s2;
  char *pcVar10;
  FILE *pFVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar12;
  undefined8 uVar13;
  
  __s2 = p;
  if (ctx->mode == BUILD_libdef) {
    libdef_endmodule(ctx);
    obuf[0] = (uint8_t)ffid;
    obuf[1] = (uint8_t)ffasmfunc;
    optr = obuf + 3;
    obuf[2] = '\0';
    modstate = 1;
    fprintf((FILE *)ctx->fp,"#ifdef %sMODULE_%s\n","LJLIB_",p);
    fprintf((FILE *)ctx->fp,"#undef %sMODULE_%s\n","LJLIB_",p);
    __s2 = "static const lua_CFunction %s%s[] = {\n";
    fprintf((FILE *)ctx->fp,"static const lua_CFunction %s%s[] = {\n","lj_lib_cf_",p);
  }
  modnamelen = strlen(p);
  if (modnamelen < 0x50) {
    strcpy(modname,p);
    return;
  }
  pcVar10 = p;
  libdef_module_cold_1();
  uVar9 = (ulong)extraout_EDX;
  if (extraout_EDX != 0) {
    ffasmfunc = ffasmfunc + 1;
  }
  iVar3 = *(int *)(pcVar10 + 8) + -6;
  uVar13 = extraout_RAX;
  switch(iVar3) {
  case 0:
    pFVar11 = *(FILE **)(pcVar10 + 0x10);
    pcVar10 = "FFDEF(%s)\n";
    break;
  case 1:
    if (modstate != 0) {
      kind = extraout_EDX;
      iVar3 = modstate;
      uVar6 = regfunc;
      if (regfunc == 1) {
        if (optr + 1 < (uint8_t *)((long)&optr + 1U)) {
          puVar1 = optr + 1;
          *optr = 0xfe;
          optr = puVar1;
          goto LAB_0010ad77;
        }
        goto LAB_0010aee8;
      }
      goto LAB_0010ae33;
    }
    goto LAB_0010aee0;
  case 2:
    sVar4 = strlen(__s2);
    if (sVar4 < 0x50) {
      strcpy(funcname,__s2);
      goto LAB_0010ad77;
    }
    libdef_func_cold_1();
LAB_0010aee0:
    libdef_func_cold_3();
LAB_0010aee8:
    libdef_func_cold_2();
  case 3:
    cVar5 = __s2[1];
    if (cVar5 != '\0') {
      lVar12 = 0;
      do {
        if (modname[lVar12] == '\0') break;
        if (cVar5 == '_') {
          __s2[lVar12 + 1] = '.';
        }
        cVar5 = __s2[lVar12 + 2];
        lVar12 = lVar12 + 1;
      } while (cVar5 != '\0');
    }
    pFVar11 = *(FILE **)(pcVar10 + 0x10);
    pcVar10 = "\"%s\",\n";
    break;
  default:
    uVar6 = CONCAT31((int3)((uint)iVar3 >> 8),extraout_EDX == 0);
    uVar7 = (ulong)uVar6;
    if (*(int *)(pcVar10 + 8) != 5 || extraout_EDX == 0) goto LAB_0010ad77;
    iVar3 = *(int *)(pcVar10 + 0x3c);
    if (0 < (long)iVar3) {
      pFVar11 = *(FILE **)(pcVar10 + 0x10);
      uVar9 = *(ulong *)(pcVar10 + 0x78);
      lVar12 = 0;
      do {
        pcVar8 = *(char **)(uVar9 + lVar12 * 8);
        if ((((*pcVar8 == 'f') && (pcVar8[1] == 'f')) && (pcVar8[2] == '_')) &&
           (iVar2 = strcmp(pcVar8 + 3,__s2), iVar2 == 0)) {
          fprintf(pFVar11,",\n%d",
                  (ulong)(uint)(*(int *)(*(long *)(pcVar10 + 0x50) + lVar12 * 8) -
                               *(int *)(pcVar10 + 0x28)));
          goto LAB_0010ad77;
        }
        uVar6 = (uint)uVar7;
        lVar12 = lVar12 + 1;
      } while (iVar3 != lVar12);
    }
    kind = (uint)uVar9;
    libdef_func_cold_4();
    iVar3 = extraout_EAX;
LAB_0010ae33:
    if (kind != 0x80) {
      if (iVar3 != 1) {
        fwrite(",\n",2,1,*(FILE **)(pcVar10 + 0x10));
      }
      modstate = 2;
      pcVar8 = "lj_cf_";
      if (kind != 0) {
        pcVar8 = "lj_ffh_";
      }
      fprintf(*(FILE **)(pcVar10 + 0x10),"  %s%s",pcVar8,__s2,in_R8,in_R9,uVar13,p);
      uVar6 = regfunc;
    }
    if (uVar6 == 2) {
      __s2 = "";
    }
    else {
      obuf[2] = obuf[2] + '\x01';
    }
    libdef_name(__s2,kind);
    goto LAB_0010ad77;
  }
  fprintf(pFVar11,pcVar10,__s2);
LAB_0010ad77:
  ffid = ffid + 1;
  regfunc = 0;
  return;
}

Assistant:

static void libdef_module(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    libdef_endmodule(ctx);
    optr = obuf;
    *optr++ = (uint8_t)ffid;
    *optr++ = (uint8_t)ffasmfunc;
    *optr++ = 0;  /* Hash table size. */
    modstate = 1;
    fprintf(ctx->fp, "#ifdef %sMODULE_%s\n", LIBDEF_PREFIX, p);
    fprintf(ctx->fp, "#undef %sMODULE_%s\n", LIBDEF_PREFIX, p);
    fprintf(ctx->fp, "static const lua_CFunction %s%s[] = {\n",
	    LABEL_PREFIX_LIBCF, p);
  }
  modnamelen = strlen(p);
  if (modnamelen > sizeof(modname)-1) {
    fprintf(stderr, "Error: module name too long: '%s'\n", p);
    exit(1);
  }
  strcpy(modname, p);
}